

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

QDebug __thiscall QVariant::qdebugHelper(QVariant *this,QDebug dbg)

{
  long lVar1;
  char16_t *pcVar2;
  _func_int **pp_Var3;
  Stream *pSVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  QDebug *this_00;
  QDebug *in_RDX;
  QDebug rhs;
  char *t;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,in_RDX);
  local_48.d = (Data *)((ulong)((dbg.stream)->buffer).d.ptr & 0xfffffffffffffffc);
  iVar6 = QMetaType::registerHelper((QMetaType *)&local_48);
  in_RDX->stream->space = false;
  QDebug::operator<<(in_RDX,"QVariant(");
  if (iVar6 == 0) {
    QDebug::operator<<(in_RDX,"Invalid");
  }
  else {
    uVar7 = (ulong)((dbg.stream)->buffer).d.ptr & 0xfffffffffffffffc;
    if (uVar7 == 0) {
      t = (char *)0x0;
    }
    else {
      t = *(char **)(uVar7 + 0x18);
    }
    this_00 = QDebug::operator<<(in_RDX,t);
    QDebug::operator<<(this_00,", ");
    pcVar2 = ((dbg.stream)->buffer).d.ptr;
    local_48.d = (Data *)((ulong)pcVar2 & 0xfffffffffffffffc);
    rhs.stream = dbg.stream;
    if (((ulong)pcVar2 & 1) != 0) {
      pp_Var3 = ((dbg.stream)->ts)._vptr_QTextStream;
      rhs.stream = (Stream *)((long)*(int *)((long)pp_Var3 + 4) + (long)pp_Var3);
    }
    bVar5 = QMetaType::debugStream((QMetaType *)&local_48,in_RDX,rhs.stream);
    if (!bVar5) {
      bVar5 = canConvert<QString>((QVariant *)dbg.stream);
      if (bVar5) {
        qvariant_cast<QString>((QString *)&local_48,(QVariant *)dbg.stream);
        QDebug::operator<<(in_RDX,(QString *)&local_48);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      }
    }
  }
  QDebug::operator<<(in_RDX,')');
  pSVar4 = in_RDX->stream;
  in_RDX->stream = (Stream *)0x0;
  (this->d).data.shared = (PrivateShared *)pSVar4;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

QDebug QVariant::qdebugHelper(QDebug dbg) const
{
    QDebugStateSaver saver(dbg);
    const uint typeId = d.type().id();
    dbg.nospace() << "QVariant(";
    if (typeId != QMetaType::UnknownType) {
        dbg << d.type().name() << ", ";
        bool streamed = d.type().debugStream(dbg, d.storage());
        if (!streamed && canConvert<QString>())
            dbg << toString();
    } else {
        dbg << "Invalid";
    }
    dbg << ')';
    return dbg;
}